

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void benchmark::anon_unknown_1::RunInThread
               (Instance *b,size_t iters,int thread_id,ThreadStats *total)

{
  Mutex *m;
  pointer this;
  ostream *local_b8;
  undefined1 local_b0 [8];
  MutexLock l;
  CheckHandler local_88;
  undefined1 local_80 [8];
  State st;
  ThreadStats *total_local;
  int thread_id_local;
  size_t iters_local;
  Instance *b_local;
  
  st.max_iterations = (size_t)total;
  State::State((State *)local_80,iters,(bool)(b->has_arg1 & 1),b->arg1,(bool)(b->has_arg2 & 1),
               b->arg2,thread_id);
  (*b->benchmark->_vptr_Benchmark[2])(b->benchmark,local_80);
  if (st._0_8_ != st._48_8_) {
    internal::CheckHandler::CheckHandler
              (&local_88,"st.iterations() == st.max_iterations",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"RunInThread",0x25c);
    local_b8 = internal::CheckHandler::GetLog(&local_88);
  }
  else {
    local_b8 = internal::GetNullLogInstance();
  }
  std::operator<<(local_b8,"Benchmark returned before State::KeepRunning() returned false!");
  if (st._0_8_ == st._48_8_) {
    m = GetBenchmarkLock();
    MutexLock::MutexLock((MutexLock *)local_b0,m);
    *(long *)st.max_iterations = st._24_8_ + *(long *)st.max_iterations;
    *(size_t *)(st.max_iterations + 8) = st.bytes_processed_ + *(long *)(st.max_iterations + 8);
    MutexLock::~MutexLock((MutexLock *)local_b0);
    this = std::
           unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
           ::operator->((unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                         *)&(anonymous_namespace)::timer_manager);
    TimerManager::Finalize(this);
    return;
  }
  internal::CheckHandler::~CheckHandler(&local_88);
}

Assistant:

EXCLUDES(GetBenchmarkLock()) {
  State st(iters, b->has_arg1, b->arg1, b->has_arg2, b->arg2, thread_id);
  b->benchmark->Run(st);
  CHECK(st.iterations() == st.max_iterations) <<
    "Benchmark returned before State::KeepRunning() returned false!";
  {
    MutexLock l(GetBenchmarkLock());
    total->bytes_processed += st.bytes_processed();
    total->items_processed += st.items_processed();
  }

  timer_manager->Finalize();
}